

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.h
# Opt level: O2

void __thiscall
wasm::WasmBinaryWriter::BinaryIndexes::BinaryIndexes(BinaryIndexes *this,Module *wasm)

{
  pointer puVar1;
  size_type sVar2;
  pointer puVar3;
  pointer puVar4;
  Global *pGVar5;
  mapped_type *pmVar6;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *curr_1;
  pointer puVar7;
  pointer puVar8;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *curr;
  pointer puVar9;
  BinaryIndexes *local_78;
  anon_class_16_2_faa1c159 addGlobal;
  Index globalCount;
  undefined1 local_31 [8];
  anon_class_1_0_00000001 addIndexes;
  
  (this->functionIndexes)._M_h._M_buckets = &(this->functionIndexes)._M_h._M_single_bucket;
  (this->functionIndexes)._M_h._M_bucket_count = 1;
  (this->functionIndexes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->functionIndexes)._M_h._M_element_count = 0;
  (this->functionIndexes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->functionIndexes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->functionIndexes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->tagIndexes)._M_h._M_buckets = &(this->tagIndexes)._M_h._M_single_bucket;
  (this->tagIndexes)._M_h._M_bucket_count = 1;
  (this->tagIndexes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tagIndexes)._M_h._M_element_count = 0;
  (this->tagIndexes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tagIndexes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tagIndexes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->globalIndexes)._M_h._M_buckets = &(this->globalIndexes)._M_h._M_single_bucket;
  (this->globalIndexes)._M_h._M_bucket_count = 1;
  (this->globalIndexes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->globalIndexes)._M_h._M_element_count = 0;
  (this->globalIndexes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->globalIndexes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->globalIndexes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->tableIndexes)._M_h._M_buckets = &(this->tableIndexes)._M_h._M_single_bucket;
  (this->tableIndexes)._M_h._M_bucket_count = 1;
  (this->tableIndexes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tableIndexes)._M_h._M_element_count = 0;
  (this->tableIndexes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tableIndexes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tableIndexes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->elemIndexes)._M_h._M_buckets = &(this->elemIndexes)._M_h._M_single_bucket;
  (this->elemIndexes)._M_h._M_bucket_count = 1;
  (this->elemIndexes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->elemIndexes)._M_h._M_element_count = 0;
  (this->elemIndexes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->elemIndexes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->elemIndexes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->memoryIndexes)._M_h._M_buckets = &(this->memoryIndexes)._M_h._M_single_bucket;
  (this->memoryIndexes)._M_h._M_bucket_count = 1;
  (this->memoryIndexes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->memoryIndexes)._M_h._M_element_count = 0;
  (this->memoryIndexes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->memoryIndexes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->memoryIndexes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->dataIndexes)._M_h._M_buckets = &(this->dataIndexes)._M_h._M_single_bucket;
  (this->dataIndexes)._M_h._M_bucket_count = 1;
  (this->dataIndexes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->dataIndexes)._M_h._M_element_count = 0;
  (this->dataIndexes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->dataIndexes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->dataIndexes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  BinaryIndexes(wasm::Module&)::{lambda(auto:1&,auto:2&)#1}::operator()
            (local_31,&wasm->functions,&this->functionIndexes);
  BinaryIndexes(wasm::Module&)::{lambda(auto:1&,auto:2&)#1}::operator()
            (local_31,&wasm->tags,&this->tagIndexes);
  BinaryIndexes(wasm::Module&)::{lambda(auto:1&,auto:2&)#1}::operator()
            (local_31,&wasm->tables,&this->tableIndexes);
  BinaryIndexes(wasm::Module&)::{lambda(auto:1&,auto:2&)#1}::operator()
            (local_31,&wasm->memories,&this->memoryIndexes);
  puVar1 = (wasm->elementSegments).
           super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar9 = (wasm->elementSegments).
                super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar9 != puVar1; puVar9 = puVar9 + 1) {
    sVar2 = (this->elemIndexes)._M_h._M_element_count;
    pmVar6 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->elemIndexes,
                          (key_type *)
                          (puVar9->_M_t).
                          super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                          .super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl);
    *pmVar6 = (mapped_type)sVar2;
  }
  puVar3 = (wasm->dataSegments).
           super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar7 = (wasm->dataSegments).
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar3; puVar7 = puVar7 + 1) {
    sVar2 = (this->dataIndexes)._M_h._M_element_count;
    pmVar6 = std::__detail::
             _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&this->dataIndexes,
                          (key_type *)
                          (puVar7->_M_t).
                          super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                          .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl);
    *pmVar6 = (mapped_type)sVar2;
  }
  addGlobal.this = (BinaryIndexes *)((long)&addGlobal.globalCount + 4);
  addGlobal.globalCount._4_4_ = 0;
  puVar4 = (wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_78 = this;
  for (puVar8 = (wasm->globals).
                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar4; puVar8 = puVar8 + 1) {
    pGVar5 = (puVar8->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if (*(char **)((long)&(pGVar5->super_Importable).module + 8) != (char *)0x0) {
      BinaryIndexes(wasm::Module&)::{lambda(auto:1*)#1}::operator()
                ((_lambda_auto_1___1_ *)&local_78,pGVar5);
    }
  }
  puVar4 = (wasm->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar8 = (wasm->globals).
                super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar8 != puVar4; puVar8 = puVar8 + 1) {
    pGVar5 = (puVar8->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
             _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
             super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
    if (*(char **)((long)&(pGVar5->super_Importable).module + 8) == (char *)0x0) {
      BinaryIndexes(wasm::Module&)::{lambda(auto:1*)#1}::operator()
                ((_lambda_auto_1___1_ *)&local_78,pGVar5);
    }
  }
  return;
}

Assistant:

BinaryIndexes(Module& wasm) {
      auto addIndexes = [&](auto& source, auto& indexes) {
        auto addIndex = [&](auto* curr) {
          auto index = indexes.size();
          indexes[curr->name] = index;
        };
        for (auto& curr : source) {
          if (curr->imported()) {
            addIndex(curr.get());
          }
        }
        for (auto& curr : source) {
          if (!curr->imported()) {
            addIndex(curr.get());
          }
        }
      };
      addIndexes(wasm.functions, functionIndexes);
      addIndexes(wasm.tags, tagIndexes);
      addIndexes(wasm.tables, tableIndexes);
      addIndexes(wasm.memories, memoryIndexes);

      for (auto& curr : wasm.elementSegments) {
        auto index = elemIndexes.size();
        elemIndexes[curr->name] = index;
      }

      for (auto& curr : wasm.dataSegments) {
        auto index = dataIndexes.size();
        dataIndexes[curr->name] = index;
      }

      // Globals may have tuple types in the IR, in which case they lower to
      // multiple globals, one for each tuple element, in the binary. Tuple
      // globals therefore occupy multiple binary indices, and we have to take
      // that into account when calculating indices.
      Index globalCount = 0;
      auto addGlobal = [&](auto* curr) {
        globalIndexes[curr->name] = globalCount;
        globalCount += curr->type.size();
      };
      for (auto& curr : wasm.globals) {
        if (curr->imported()) {
          addGlobal(curr.get());
        }
      }
      for (auto& curr : wasm.globals) {
        if (!curr->imported()) {
          addGlobal(curr.get());
        }
      }
    }